

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::insert_move(Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
              *this,Node *keyval)

{
  uint8_t *puVar1;
  float *pfVar2;
  byte bVar3;
  Node *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Character CVar7;
  float fVar8;
  bool bVar9;
  uint8_t *puVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  size_t insertion_idx;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar9 = try_increase_info(this);
    if (!bVar9) {
      throwOverflowError(this);
    }
  }
  uVar13 = (ulong)(keyval->mData).first * -0x3f1b720669c11bf9;
  uVar12 = ((uint)(uVar13 >> 0x20) & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f);
  insertion_idx = (uVar13 << 0x20 | uVar13 >> 0x20) >> 5 & this->mMask;
  puVar10 = this->mInfo;
  bVar3 = puVar10[insertion_idx];
  while (uVar12 = uVar12 + this->mInfoInc, uVar12 <= bVar3) {
    lVar11 = insertion_idx + 1;
    insertion_idx = insertion_idx + 1;
    bVar3 = puVar10[lVar11];
  }
  if (0xff < (uVar12 & 0xff) + this->mInfoInc) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar11 = 1;
  do {
    lVar11 = lVar11 + -1;
    puVar1 = puVar10 + insertion_idx;
    puVar10 = puVar10 + 1;
  } while (*puVar1 != '\0');
  pNVar4 = this->mKeyVals;
  if (lVar11 != 0) {
    shiftUp(this,insertion_idx - lVar11,insertion_idx);
  }
  *(undefined8 *)&pNVar4[insertion_idx].mData.second.texcoords[1].y =
       *(undefined8 *)&(keyval->mData).second.texcoords[1].y;
  CVar7 = (keyval->mData).first;
  fVar8 = (keyval->mData).second.origin.x;
  uVar5 = *(undefined8 *)&(keyval->mData).second.origin.y;
  uVar6 = *(undefined8 *)&(keyval->mData).second.texcoords[0].y;
  pfVar2 = &pNVar4[insertion_idx].mData.second.dimensions.y;
  *(undefined8 *)pfVar2 = *(undefined8 *)&(keyval->mData).second.dimensions.y;
  *(undefined8 *)(pfVar2 + 2) = uVar6;
  pNVar4 = pNVar4 + insertion_idx;
  (pNVar4->mData).first = CVar7;
  (pNVar4->mData).second.origin.x = fVar8;
  *(undefined8 *)&(pNVar4->mData).second.origin.y = uVar5;
  this->mInfo[insertion_idx] = (uint8_t)uVar12;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }